

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_buglist(CHAR_DATA *ch,char *argument)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  MYSQL *pMVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  char *pcVar11;
  char str [200];
  char query [4608];
  char arg1 [4608];
  char arg2 [4608];
  char local_3708 [208];
  char local_3638 [4608];
  int local_2438;
  char local_2434;
  char local_1238 [4616];
  
  if (*argument == '\0') {
    send_to_char("Syntax:  buglist <number>                          - detailed information about bug <number>\n\r"
                 ,ch);
    send_to_char("         buglist last <number>                     - list <number> most recent bugs\n\r"
                 ,ch);
    send_to_char("         buglist add <brief one line summary>      - report bug (it prompts for detailed description)\n\r"
                 ,ch);
    pcVar11 = 
    "         buglist done <number>                     - mark bug <number> as resolved\n\r";
LAB_00271824:
    send_to_char(pcVar11,ch);
    return;
  }
  bVar4 = is_npc(ch);
  if (bVar4) {
    pcVar11 = "Die.\n\r";
    goto LAB_00271824;
  }
  pcVar11 = one_argument(argument,(char *)&local_2438);
  if (local_2434 == '\0' && local_2438 == 0x6f747561) {
    builtin_strncpy(local_3638 + 0x30,"ID desc LIMIT 8",0x10);
    builtin_strncpy(local_3638 + 0x20,"us = 0 ORDER BY ",0x10);
    builtin_strncpy(local_3638 + 0x10,"glist WHERE Stat",0x10);
    builtin_strncpy(local_3638,"SELECT * from bu",0x10);
    builtin_strncpy(local_3708,"Displaying last 8 unresolved bugs.\n\r",0x25);
LAB_002719e7:
    pMVar7 = open_conn();
    if (pMVar7 != (MYSQL *)0x0) {
      send_to_char(local_3708,ch);
      mysql_query(pMVar7,local_3638);
      lVar8 = mysql_store_result(pMVar7);
      if (lVar8 == 0) {
        send_to_char("No bugs found.\n\r",ch);
      }
      else {
        send_to_char("ID    Added By    Summary\n\r",ch);
        send_to_char("---   ---------   ------------\n\r",ch);
        puVar10 = (undefined8 *)mysql_fetch_row(lVar8);
        if (puVar10 != (undefined8 *)0x0) {
          do {
            uVar1 = *puVar10;
            uVar2 = puVar10[1];
            uVar3 = puVar10[3];
            iVar6 = atoi((char *)puVar10[5]);
            pcVar11 = "";
            if (iVar6 == 1) {
              pcVar11 = "(SOLVED)";
            }
            sprintf(local_3638,"%-5s %-11s %s %s\n\r",uVar1,uVar2,uVar3,pcVar11);
            send_to_char(local_3638,ch);
            puVar10 = (undefined8 *)mysql_fetch_row(lVar8);
          } while (puVar10 != (undefined8 *)0x0);
        }
      }
      mysql_free_result(lVar8);
LAB_00271bc4:
      mysql_close(pMVar7);
      return;
    }
  }
  else {
    bVar4 = is_number((char *)&local_2438);
    if (!bVar4) {
      if (local_2434 != '\0' || local_2438 != 0x7473616c) {
        if (local_2438 == 0x646461) {
          pcVar11 = palloc_string(pcVar11);
          ch->pcdata->temp_str = pcVar11;
          send_to_char("Please enter a description of the bug with as much information as possible:\n\r"
                       ,ch);
          enter_text(ch,buglist_end_fun);
          return;
        }
        if (local_2434 == '\0' && local_2438 == 0x656e6f64) {
          one_argument(pcVar11,local_1238);
          bVar4 = is_number(local_1238);
          if (bVar4) {
            uVar5 = atoi(local_1238);
            sprintf(local_3638,"UPDATE buglist SET Status = 1 WHERE ID = %d",(ulong)uVar5);
            one_query(local_3638);
            pcVar11 = "Bug marked as resolved.\n\r";
          }
          else {
            pcVar11 = "Invalid number of bug to complete.\n\r";
          }
        }
        else {
          pcVar11 = "Invalid option.\n\r";
        }
        goto LAB_00271b2e;
      }
      one_argument(pcVar11,local_1238);
      bVar4 = is_number(local_1238);
      if (!bVar4) {
        pcVar11 = "Invalid number of last bugs to display.\n\r";
        goto LAB_00271b2e;
      }
      uVar5 = atoi(local_1238);
      sprintf(local_3638,"SELECT * from buglist ORDER BY ID desc LIMIT %d",(ulong)uVar5);
      uVar5 = atoi(local_1238);
      sprintf(local_3708,"Displaying last %d bugs.\n\r",(ulong)uVar5);
      goto LAB_002719e7;
    }
    pMVar7 = open_conn();
    if (pMVar7 != (MYSQL *)0x0) {
      uVar5 = atoi((char *)&local_2438);
      sprintf(local_3638,"SELECT * from buglist WHERE ID = %d",(ulong)uVar5);
      uVar5 = atoi((char *)&local_2438);
      sprintf(local_3708,"Displaying bug #%d:\n\r",(ulong)uVar5);
      send_to_char(local_3708,ch);
      mysql_query(pMVar7,local_3638);
      lVar8 = mysql_store_result(pMVar7);
      pcVar11 = "Unable to find that bug.\n\r";
      if ((lVar8 != 0) && (lVar9 = mysql_fetch_row(lVar8), lVar9 != 0)) {
        uVar1 = *(undefined8 *)(lVar9 + 8);
        uVar2 = *(undefined8 *)(lVar9 + 0x10);
        iVar6 = atoi(*(char **)(lVar9 + 0x28));
        pcVar11 = "Unresolved";
        if (iVar6 == 1) {
          pcVar11 = "Resolved";
        }
        sprintf(local_3638,
                "Added by: %-15s Date: %-15s\n\rStatus: %s\n\rSummary: %s\n\rDescription: %s\n\r",
                uVar1,uVar2,pcVar11,*(undefined8 *)(lVar9 + 0x18),*(undefined8 *)(lVar9 + 0x20));
        pcVar11 = local_3638;
      }
      send_to_char(pcVar11,ch);
      mysql_free_result(lVar8);
      goto LAB_00271bc4;
    }
  }
  pcVar11 = "Error opening bug database.\n\r";
LAB_00271b2e:
  send_to_char(pcVar11,ch);
  return;
}

Assistant:

void do_buglist(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL], arg2[MSL], query[MSL], str[200];
	MYSQL *conn;
	MYSQL_RES *res_set = nullptr;
	MYSQL_ROW row = nullptr;

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:  buglist <number>                          - detailed information about bug <number>\n\r", ch);
		send_to_char("         buglist last <number>                     - list <number> most recent bugs\n\r", ch);
		send_to_char("         buglist add <brief one line summary>      - report bug (it prompts for detailed description)\n\r", ch);
		send_to_char("         buglist done <number>                     - mark bug <number> as resolved\n\r", ch);
		return;
	}

	if (is_npc(ch))
	{
		send_to_char("Die.\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);

	// status 0 = unresolved, 1 = resolved, 2 = my head is on fire
	if (!strcmp(arg1, "auto"))
	{
		sprintf(query, "SELECT * from buglist WHERE Status = 0 ORDER BY ID desc LIMIT 8");
		sprintf(str, "Displaying last 8 unresolved bugs.\n\r");
	}
	else if (is_number(arg1))
	{
		conn = open_conn();

		if (!conn)
		{
			send_to_char("Error opening bug database.\n\r", ch);
			return;
		}

		sprintf(query, "SELECT * from buglist WHERE ID = %d", atoi(arg1));
		sprintf(str, "Displaying bug #%d:\n\r", atoi(arg1));
		send_to_char(str, ch);

		mysql_query(conn, query);

		res_set = mysql_store_result(conn);

		if (!res_set || !(row = mysql_fetch_row(res_set)))
			send_to_char("Unable to find that bug.\n\r", ch);
		else
		{
			sprintf(query, "Added by: %-15s Date: %-15s\n\rStatus: %s\n\rSummary: %s\n\rDescription: %s\n\r",
				row[1],
				row[2],
				atoi(row[5]) == 1 ? "Resolved" : "Unresolved",
				row[3],
				row[4]);
			send_to_char(query, ch);
		}

		mysql_free_result(res_set);
		mysql_close(conn);
		return;
	}
	else if (!strcmp(arg1, "last"))
	{
		argument = one_argument(argument, arg2);

		if (!is_number(arg2))
		{
			send_to_char("Invalid number of last bugs to display.\n\r", ch);
			return;
		}

		sprintf(query, "SELECT * from buglist ORDER BY ID desc LIMIT %d", atoi(arg2));
		sprintf(str, "Displaying last %d bugs.\n\r", atoi(arg2));
	}
	else if (!strcmp(arg1, "add"))
	{
		ch->pcdata->temp_str = palloc_string(argument);

		send_to_char("Please enter a description of the bug with as much information as possible:\n\r", ch);
		enter_text(ch, buglist_end_fun);
		return;
	}
	else if (!strcmp(arg1, "done"))
	{
		argument = one_argument(argument, arg2);

		if (!is_number(arg2))
		{
			send_to_char("Invalid number of bug to complete.\n\r", ch);
			return;
		}

		sprintf(query, "UPDATE buglist SET Status = 1 WHERE ID = %d", atoi(arg2));
		one_query(query);

		send_to_char("Bug marked as resolved.\n\r", ch);

		return;
	}
	else
	{
		send_to_char("Invalid option.\n\r", ch);
		return;
	}

	conn = open_conn();

	if (!conn)
	{
		send_to_char("Error opening bug database.\n\r", ch);
		return;
	}

	send_to_char(str, ch);
	mysql_query(conn, query);

	res_set = mysql_store_result(conn);

	if (!res_set)
	{
		send_to_char("No bugs found.\n\r", ch);
	}
	else
	{
		send_to_char("ID    Added By    Summary\n\r", ch);
		send_to_char("---   ---------   ------------\n\r", ch);

		while ((row = mysql_fetch_row(res_set)) != nullptr)
		{
			sprintf(query, "%-5s %-11s %s %s\n\r", row[0], row[1], row[3], atoi(row[5]) == 1 ? "(SOLVED)" : "");
			send_to_char(query, ch);
		}
	}

	mysql_free_result(res_set);
	mysql_close(conn);
}